

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O2

void __thiscall sim_slicing_bit_Test::TestBody(sim_slicing_bit_Test *this)

{
  uint *lhs;
  Generator *this_00;
  Var *pVVar1;
  char *pcVar2;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  undefined1 local_190 [8];
  Context context;
  allocator<char> local_62;
  allocator_type local_61;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  AssertHelper local_28;
  
  kratos::Context::Context((Context *)local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"mod",(allocator<char> *)&local_60);
  this_00 = kratos::Context::generator((Context *)local_190,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"a",(allocator<char> *)&local_60);
  pVVar1 = kratos::Generator::var(this_00,(string *)local_48,3);
  std::__cxx11::string::~string((string *)local_48);
  local_60._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_100000001;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_48,__l,(allocator_type *)&local_28);
  context.tracked_generators_._M_h._M_single_bucket =
       (__node_base_ptr)
       kratos::compute_var_high_low
                 (pVVar1,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          *)local_48);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_48);
  local_60._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"high","1",
             (uint *)&context.tracked_generators_._M_h._M_single_bucket,(int *)&local_60);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((pair<unsigned_int,_unsigned_int>)local_60._M_impl.super__Vector_impl_data._M_start !=
        (pair<unsigned_int,_unsigned_int>)0x0) {
      (**(code **)(*(long *)local_60._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  lhs = (uint *)((long)&context.tracked_generators_._M_h._M_single_bucket + 4);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  local_60._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"low","1",lhs,(int *)&local_60);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x10,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((pair<unsigned_int,_unsigned_int>)local_60._M_impl.super__Vector_impl_data._M_start !=
        (pair<unsigned_int,_unsigned_int>)0x0) {
      (**(code **)(*(long *)local_60._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"b",&local_62);
  local_28.data_ = (AssertHelperData *)0x200000002;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,__l_00,&local_61);
  pVVar1 = kratos::Generator::var
                     (this_00,(string *)local_48,4,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::__cxx11::string::~string((string *)local_48);
  local_60._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_100000001;
  local_60._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_100000001;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_60;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_48,__l_01,(allocator_type *)&local_28);
  context.tracked_generators_._M_h._M_single_bucket =
       (__node_base_ptr)
       kratos::compute_var_high_low
                 (pVVar1,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          *)local_48);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_48);
  local_60._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,0xf);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"high","4 * 4 - 1",
             (uint *)&context.tracked_generators_._M_h._M_single_bucket,(int *)&local_60);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((pair<unsigned_int,_unsigned_int>)local_60._M_impl.super__Vector_impl_data._M_start !=
        (pair<unsigned_int,_unsigned_int>)0x0) {
      (**(code **)(*(long *)local_60._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  local_60._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,0xc);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_48,"low","4 * 3",lhs,(int *)&local_60);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((pair<unsigned_int,_unsigned_int>)local_60._M_impl.super__Vector_impl_data._M_start !=
        (pair<unsigned_int,_unsigned_int>)0x0) {
      (**(code **)(*(long *)local_60._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kratos::Context::~Context((Context *)local_190);
  return;
}

Assistant:

TEST(sim, slicing_bit) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 3);
    auto [high, low] = compute_var_high_low(&a, {{1, 1}});
    EXPECT_EQ(high, 1);
    EXPECT_EQ(low, 1);
    auto &b = mod.var("b", 4, {2, 2});
    std::tie(high, low) = compute_var_high_low(&b, {{1, 1}, {1, 1}});
    EXPECT_EQ(high, 4 * 4 - 1);
    EXPECT_EQ(low, 4 * 3);
}